

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O0

int DataManager::getNodeValue(int index,int param,double *value,Network *nw)

{
  int iVar1;
  double extraout_XMM0_Qa;
  undefined8 local_58;
  double dummy;
  Node *node;
  double ccf;
  double qcf;
  double pcf;
  double lcf;
  Network *nw_local;
  double *value_local;
  int local_10;
  int param_local;
  int index_local;
  
  *value = 0.0;
  if ((-1 < index) &&
     (lcf = (double)nw, nw_local = (Network *)value, value_local._4_4_ = param, local_10 = index,
     iVar1 = Network::count(nw,NODE), index < iVar1)) {
    pcf = Network::ucf((Network *)lcf,LENGTH);
    qcf = Network::ucf((Network *)lcf,PRESSURE);
    ccf = Network::ucf((Network *)lcf,FLOW);
    node = (Node *)Network::ucf((Network *)lcf,CONCEN);
    dummy = (double)Network::node((Network *)lcf,local_10);
    local_58 = 0;
    switch(value_local._4_4_) {
    case 0:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(((Node *)dummy)->elev * pcf);
      break;
    case 1:
      break;
    case 2:
      break;
    case 3:
      (*(((Node *)dummy)->super_Element)._vptr_Element[7])(((Node *)dummy)->head,dummy,&local_58);
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(extraout_XMM0_Qa * ccf);
      break;
    case 4:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(((Node *)dummy)->initQual * (double)node);
      break;
    case 5:
    case 6:
    case 7:
    case 0xd:
      iVar1 = getQualSourceValue(value_local._4_4_,(Node *)dummy,(double *)nw_local,(Network *)lcf);
      return iVar1;
    default:
      iVar1 = getTankValue(value_local._4_4_,(Node *)dummy,(double *)nw_local,(Network *)lcf);
      return iVar1;
    case 9:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(((Node *)dummy)->fullDemand * ccf);
      break;
    case 10:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(((Node *)dummy)->head * pcf);
      break;
    case 0xb:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((((Node *)dummy)->head - ((Node *)dummy)->elev) * qcf);
      break;
    case 0xc:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(((Node *)dummy)->quality * (double)node);
      break;
    case 0x19:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(((Node *)dummy)->actualDemand * ccf);
      break;
    case 0x1a:
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(((Node *)dummy)->outflow * ccf);
      iVar1 = (*(((Node *)dummy)->super_Element)._vptr_Element[2])();
      if (iVar1 != 0) {
        (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)(nw_local->graph).adjLists.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start ^ 0x8000000000000000);
      }
    }
    return 0;
  }
  return 0xcd;
}

Assistant:

int DataManager::getNodeValue(int index, int param, double* value, Network* nw)
{
    *value = 0.0;
    if ( index < 0 || index >= nw->count(Element::NODE) ) return 205;

    double lcf = nw->ucf(Units::LENGTH);
    double pcf = nw->ucf(Units::PRESSURE);
    double qcf = nw->ucf(Units::FLOW);
    double ccf = nw->ucf(Units::CONCEN);

    Node* node = nw->node(index);
    double dummy = 0.0;
    switch (param)
    {
    case EN_ELEVATION:
        *value = node->elev * lcf;
        break;

    case EN_BASEDEMAND:   break;
    case EN_BASEPATTERN:      break;

    case EN_FULLDEMAND:
        *value = node->fullDemand * qcf;
        break;

    case EN_ACTUALDEMAND:
        *value = node->actualDemand * qcf;
        break;

    case EN_OUTFLOW:
        *value = node->outflow * qcf;
         if ( node->type() != Node::JUNCTION ) *value = -(*value);
         break;

    case EN_EMITTERFLOW:
        *value = node->findEmitterFlow(node->head, dummy) * qcf;
        break;

    case EN_HEAD:
        *value = node->head * lcf;
        break;

    case EN_PRESSURE:
        *value = (node->head - node->elev) * pcf;
        break;

    case EN_INITQUAL:
        *value = node->initQual * ccf;
        break;

    case EN_QUALITY:
        *value = node->quality * ccf;
        break;

    case EN_SOURCEQUAL:
    case EN_SOURCEPAT:
    case EN_SOURCETYPE:
    case EN_SOURCEMASS:
        return getQualSourceValue(param, node, value, nw);

    // ... remaining node parameters apply only to Tanks
    default: return getTankValue(param, node, value, nw);
    }
    return 0;
}